

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_schedule_plugin(_func_void *newplugin,int cycle,int shift)

{
  fsnav_plugin *pfVar1;
  size_t sVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  cVar3 = fsnav_add_plugin(newplugin);
  cVar4 = '\0';
  iVar7 = 0;
  if (cVar3 != '\0') {
    iVar8 = -cycle;
    if (0 < cycle) {
      iVar8 = cycle;
    }
    if (cycle != 0) {
      iVar5 = -cycle;
      if (0 < cycle) {
        iVar5 = cycle;
      }
      iVar7 = shift + iVar5;
      iVar6 = -iVar7;
      do {
        iVar7 = iVar7 - iVar5;
        iVar6 = iVar6 + iVar5;
      } while (iVar8 <= iVar7);
      iVar8 = 0;
      if (0 < iVar7) {
        iVar8 = iVar7;
      }
      iVar7 = (((iVar8 - (uint)(iVar8 != iVar7)) + iVar6) / (iVar5 + (uint)(iVar5 == 0)) +
              (uint)(iVar8 != iVar7)) * iVar5 + iVar7;
    }
    pfVar1 = (fsnav->core).plugins;
    sVar2 = (fsnav->core).plugin_count;
    pfVar1[sVar2 - 1].cycle = cycle;
    pfVar1[sVar2 - 1].shift = iVar7;
    pfVar1[sVar2 - 1].tick = 0;
    cVar4 = '\x01';
  }
  return cVar4;
}

Assistant:

char fsnav_schedule_plugin(void(*newplugin)(void), int cycle, int shift)
{
	int abs_cycle;

	// add to the execution list
	if (!fsnav_add_plugin(newplugin))
		return 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// set scheduling parameters
	fsnav->core.plugins[fsnav->core.plugin_count-1].cycle = cycle;
	fsnav->core.plugins[fsnav->core.plugin_count-1].shift = shift;
	fsnav->core.plugins[fsnav->core.plugin_count-1].tick  = 0;

	return 1;
}